

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

float_specs
duckdb_fmt::v6::internal::parse_float_type_spec<duckdb_fmt::v6::internal::error_handler,char>
          (basic_format_specs<char> *specs,error_handler *eh)

{
  char cVar1;
  byte bVar2;
  uint uVar3;
  long *plVar5;
  uint uVar6;
  size_type *psVar7;
  uint uVar8;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  ulong uVar4;
  
  uVar8 = (uint)(byte)specs->thousands * 0x10000;
  bVar2 = (byte)specs->field_0x9 >> 7;
  uVar6 = (uint)bVar2 * 0x20000000;
  uVar3 = uVar6 + uVar8;
  uVar4 = (ulong)uVar3;
  cVar1 = specs->type;
  switch(cVar1) {
  case 'a':
switchD_002a2d23_caseD_61:
    uVar4 = (ulong)(uVar3 | 3);
    break;
  case 'b':
  case 'c':
  case 'd':
  case 'h':
  case 'i':
  case 'j':
  case 'k':
  case 'm':
switchD_002a2d0b_caseD_42:
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_58,'\x01');
    std::operator+(&local_38,"Invalid type specifier \"",&local_58);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_38);
    local_78._M_dataplus._M_p = (pointer)*plVar5;
    psVar7 = (size_type *)(plVar5 + 2);
    if ((size_type *)local_78._M_dataplus._M_p == psVar7) {
      local_78.field_2._M_allocated_capacity = *psVar7;
      local_78.field_2._8_8_ = plVar5[3];
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    }
    else {
      local_78.field_2._M_allocated_capacity = *psVar7;
    }
    local_78._M_string_length = plVar5[1];
    *plVar5 = (long)psVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    error_handler::on_error(eh,&local_78);
  case 'e':
switchD_002a2d23_caseD_65:
    uVar8 = 0x20000000;
    if (specs->precision == 0) {
      uVar8 = uVar6;
    }
    uVar4 = (ulong)(uVar3 & 0x1ffffffe | uVar8 | 1);
    break;
  case 'f':
switchD_002a2d23_caseD_66:
    uVar8 = 0x20000000;
    if (specs->precision == 0) {
      uVar8 = uVar6;
    }
    uVar4 = (ulong)(uVar3 & 0x1ffffffd | uVar8 | 2);
  case 'g':
    break;
  case 'l':
  case 'n':
switchD_002a2d0b_caseD_4c:
    uVar4 = (ulong)(uVar3 | 0x2000000);
    break;
  default:
    switch(cVar1) {
    case 'A':
      uVar3 = uVar3 | 0x1000000;
      goto switchD_002a2d23_caseD_61;
    case 'B':
    case 'C':
    case 'D':
    case 'H':
    case 'I':
    case 'J':
    case 'K':
      goto switchD_002a2d0b_caseD_42;
    case 'E':
      uVar3 = uVar3 | 0x1000000;
      goto switchD_002a2d23_caseD_65;
    case 'F':
      uVar3 = uVar3 | 0x1000000;
      goto switchD_002a2d23_caseD_66;
    case 'G':
      uVar4 = (ulong)(uVar3 | 0x1000000);
      break;
    case 'L':
      goto switchD_002a2d0b_caseD_4c;
    default:
      if (cVar1 != '\0') goto switchD_002a2d0b_caseD_42;
      uVar4 = (ulong)((uint)(specs->precision != 0 | bVar2) << 0x1d | uVar8);
    }
  }
  return (float_specs)(uVar4 << 0x20);
}

Assistant:

FMT_CONSTEXPR float_specs parse_float_type_spec(
    const basic_format_specs<Char>& specs, ErrorHandler&& eh = {}) {

  auto result = float_specs();
  result.thousand_sep = specs.thousands;
  result.trailing_zeros = specs.alt;
  switch (specs.type) {
  case 0:
    result.format = float_format::general;
    result.trailing_zeros |= specs.precision != 0;
    break;
  case 'G':
    result.upper = true;
    FMT_FALLTHROUGH;
  case 'g':
    result.format = float_format::general;
    break;
  case 'E':
    result.upper = true;
    FMT_FALLTHROUGH;
  case 'e':
    result.format = float_format::exp;
    result.trailing_zeros |= specs.precision != 0;
    break;
  case 'F':
    result.upper = true;
    FMT_FALLTHROUGH;
  case 'f':
    result.format = float_format::fixed;
    result.trailing_zeros |= specs.precision != 0;
    break;
#if FMT_DEPRECATED_PERCENT
  case '%':
    result.format = float_format::fixed;
    result.percent = true;
    break;
#endif
  case 'A':
    result.upper = true;
    FMT_FALLTHROUGH;
  case 'a':
    result.format = float_format::hex;
    break;
  case 'n':
  case 'l':
  case 'L':
    result.locale = true;
    break;
  default:
    eh.on_error("Invalid type specifier \"" + std::string(1, specs.type) + "\" for formatting a value of type float");
    break;
  }
  return result;
}